

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-graphics.cpp
# Opt level: O1

string * Game::Graphics::EndOfEndlessPrompt_abi_cxx11_(void)

{
  ostream *poVar1;
  string *in_RDI;
  ostringstream endless_mode_richtext;
  ostringstream aoStack_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_188);
  poVar1 = Color::operator<<((ostream *)aoStack_188,&red);
  poVar1 = Color::operator<<(poVar1,&bold_on);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"End of endless mode! Thank you for playing!",0x2b);
  poVar1 = Color::operator<<(poVar1,&def);
  poVar1 = Color::operator<<(poVar1,&bold_off);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\n\n",3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_188);
  std::ios_base::~ios_base(local_118);
  return in_RDI;
}

Assistant:

std::string EndOfEndlessPrompt() {
  constexpr auto endless_mode_text =
      "End of endless mode! Thank you for playing!";
  constexpr auto sp = "  ";
  std::ostringstream endless_mode_richtext;
  endless_mode_richtext << red << bold_on << sp << endless_mode_text << def
                        << bold_off << "\n\n\n";
  return endless_mode_richtext.str();
}